

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.hpp
# Opt level: O0

void __thiscall
ROM::Description::Description<char_const*,std::initializer_list<unsigned_int>>
          (Description *this,Name name,string *machine_name,string *descriptive_name,
          char *file_names,size_t size,initializer_list<unsigned_int> crc32s)

{
  initializer_list<unsigned_int> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  size_t __s;
  size_type sVar1;
  reference puVar2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_108;
  _Rb_tree_const_iterator<unsigned_int> local_a8;
  allocator<unsigned_int> local_9a;
  less<unsigned_int> local_99;
  iterator local_98;
  size_type sStack_90;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_83;
  undefined1 local_82;
  allocator<char> local_81;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  iterator local_58;
  size_type local_50;
  size_t local_38;
  size_t size_local;
  char *file_names_local;
  string *descriptive_name_local;
  string *machine_name_local;
  Description *pDStack_10;
  Name name_local;
  Description *this_local;
  
  this->name = name;
  local_38 = size;
  size_local = (size_t)file_names;
  file_names_local = (char *)descriptive_name;
  descriptive_name_local = machine_name;
  machine_name_local._4_4_ = name;
  pDStack_10 = this;
  std::__cxx11::string::string((string *)&this->machine_name,(string *)machine_name);
  std::__cxx11::string::string((string *)&this->descriptive_name,(string *)descriptive_name);
  __s = size_local;
  local_82 = 1;
  local_80 = &local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,(char *)__s,&local_81);
  local_82 = 0;
  local_58 = &local_78;
  local_50 = 1;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_83);
  __l_00._M_len = local_50;
  __l_00._M_array = local_58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->file_names,__l_00,&local_83);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_83);
  local_108 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_58;
  do {
    local_108 = local_108 + -1;
    std::__cxx11::string::~string((string *)local_108);
  } while (local_108 != &local_78);
  std::allocator<char>::~allocator(&local_81);
  this->size = local_38;
  local_98 = crc32s._M_array;
  sStack_90 = crc32s._M_len;
  std::allocator<unsigned_int>::allocator(&local_9a);
  __l._M_len = sStack_90;
  __l._M_array = local_98;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->crc32s,__l,&local_99,&local_9a);
  std::allocator<unsigned_int>::~allocator(&local_9a);
  sVar1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                    (&this->crc32s);
  bVar3 = false;
  if (sVar1 == 1) {
    local_a8._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                   (&this->crc32s);
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_a8);
    bVar3 = *puVar2 == 0;
  }
  if (bVar3) {
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::clear
              (&this->crc32s);
  }
  return;
}

Assistant:

Description(
			Name name, std::string machine_name, std::string descriptive_name, FileNameT file_names, size_t size, CRC32T crc32s = uint32_t(0)
		) : name{name}, machine_name{machine_name}, descriptive_name{descriptive_name}, file_names{file_names}, size{size}, crc32s{crc32s} {
			// Slightly lazy: deal with the case where the constructor wasn't provided with any
			// CRCs by spotting that the set has exactly one member, which has value 0. The alternative
			// would be to provide a partial specialisation that never put anything into the set.
			if(this->crc32s.size() == 1 && !*this->crc32s.begin()) {
				this->crc32s.clear();
			}
		}